

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O3

void BinaryCache::AddImportPath(char *path)

{
  undefined *puVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  ulong uVar5;
  ulong uVar6;
  char *importPath;
  char *local_28;
  
  lVar2 = importPaths;
  uVar5 = (ulong)DAT_0022728c;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      iVar3 = strcmp(*(char **)(lVar2 + uVar6 * 8),path);
      if (iVar3 == 0) {
        return;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  puVar1 = NULLC::alloc;
  sVar4 = strlen(path);
  __dest = (char *)(*(code *)puVar1)((int)sVar4 + 1);
  local_28 = __dest;
  strcpy(__dest,path);
  uVar5 = (ulong)DAT_0022728c;
  if (DAT_0022728c == DAT_00227288) {
    FastVector<char_*,_false,_false>::grow_and_add
              ((FastVector<char_*,_false,_false> *)&importPaths,DAT_0022728c,&local_28);
  }
  else {
    DAT_0022728c = DAT_0022728c + 1;
    *(char **)(importPaths + uVar5 * 8) = __dest;
  }
  return;
}

Assistant:

void BinaryCache::AddImportPath(const char* path)
{
	for(unsigned int i = 0; i < importPaths.size(); i++)
	{
		if(strcmp(importPaths[i], path) == 0)
			return;
	}

	char *importPath = (char*)NULLC::alloc(int(strlen(path)) + 1);
	strcpy(importPath, path);
	importPaths.push_back(importPath);
}